

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# date.cpp
# Opt level: O0

Month month_of_day(DaysInYear days_in_year)

{
  bool bVar1;
  uint uVar2;
  int leap_additive;
  int *months;
  int y;
  int d;
  DaysInYear days_in_year_local;
  
  d = days_in_year.days;
  y = days_in_year.year;
  days_in_months(y);
  bVar1 = leapyear(y);
  uVar2 = (uint)bVar1;
  if (d < 0x1f) {
    days_in_year_local.year = 1;
  }
  else if (d < (int)(uVar2 + 0x3b)) {
    days_in_year_local.year = 2;
  }
  else if (d < (int)(uVar2 + 0x5a)) {
    days_in_year_local.year = 3;
  }
  else if (d < (int)(uVar2 + 0x78)) {
    days_in_year_local.year = 4;
  }
  else if (d < (int)(uVar2 + 0x97)) {
    days_in_year_local.year = 5;
  }
  else if (d < (int)(uVar2 + 0xb5)) {
    days_in_year_local.year = 6;
  }
  else if (d < (int)(uVar2 + 0xd4)) {
    days_in_year_local.year = 7;
  }
  else if (d < (int)(uVar2 + 0xf3)) {
    days_in_year_local.year = 8;
  }
  else if (d < (int)(uVar2 + 0x111)) {
    days_in_year_local.year = 9;
  }
  else if (d < (int)(uVar2 + 0x130)) {
    days_in_year_local.year = 10;
  }
  else if (d < (int)(uVar2 + 0x14e)) {
    days_in_year_local.year = 0xb;
  }
  else {
    days_in_year_local.year = 0xc;
  }
  return days_in_year_local.year;
}

Assistant:

Month month_of_day(DaysInYear days_in_year)
{
	auto d = days_in_year.days;
	auto y = days_in_year.year;
	auto months = days_in_months(y);
	auto leap_additive = leapyear(y) ? 1 : 0;
	if (d < 31)
		return Month::jan;
	else if (d < 59 + leap_additive)
		return Month::feb;
	else if (d < 90 + leap_additive)
		return Month::mar;
	else if (d < 120 + leap_additive)
		return Month::apr;
	else if (d < 151 + leap_additive)
		return Month::may;
	else if (d < 181 + leap_additive)
		return Month::jun;
	else if (d < 212 + leap_additive)
		return Month::jul;
	else if (d < 243 + leap_additive)
		return Month::aug;
	else if (d < 273 + leap_additive)
		return Month::sep;
	else if (d < 304 + leap_additive)
		return Month::oct;
	else if (d < 334 + leap_additive)
		return Month::nov;
	else
		return Month::dec;
}